

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::SwiftCompilerShellCommand::processDiscoveredDependencies(llbuild::core::
TaskInterface,llvm::StringRef)::DepsActions::actOnRuleDependency(llvm::StringRef,llvm::StringRef_
          (void *this,StringRef dependency,StringRef unescapedWord)

{
  BuildSystemImpl *this_00;
  BuildSystemDelegate *pBVar1;
  void *extraout_RDX;
  TaskInterface ti;
  StringRef path;
  BuildKey local_70;
  KeyType local_50;
  void *local_30;
  DepsActions *this_local;
  StringRef unescapedWord_local;
  StringRef dependency_local;
  
  unescapedWord_local.Data = (char *)unescapedWord.Length;
  path.Length = (DepsActions *)unescapedWord.Data;
  unescapedWord_local.Length = (size_t)dependency.Data;
  if (*(int *)((long)this + 0x34) == 0) {
    path.Data = unescapedWord_local.Data;
    local_30 = this;
    this_local = path.Length;
    llbuild::buildsystem::BuildKey::makeNode(&local_70,(BuildKey *)path.Length,path);
    llbuild::buildsystem::BuildKey::toData(&local_50,&local_70);
    llbuild::core::TaskInterface::discoveredDependency((TaskInterface *)((long)this + 8),&local_50);
    llbuild::core::KeyType::~KeyType(&local_50);
    llbuild::buildsystem::BuildKey::~BuildKey(&local_70);
    ti.ctx = extraout_RDX;
    ti.impl = *(void **)((long)this + 0x10);
    this_00 = anon_unknown.dwarf_ecf33::getBuildSystem
                        (*(anon_unknown_dwarf_ecf33 **)((long)this + 8),ti);
    pBVar1 = anon_unknown.dwarf_ecf33::BuildSystemImpl::getDelegate(this_00);
    (*pBVar1->_vptr_BuildSystemDelegate[0xf])
              (pBVar1,*(undefined8 *)((long)this + 0x28),this_local,unescapedWord_local.Data,0);
  }
  return;
}

Assistant:

virtual void actOnRuleDependency(StringRef dependency,
                                       StringRef unescapedWord) override {
        // Only process dependencies for the first rule (the output file), the
        // rest are identical.
        if (ruleNumber == 0) {
          ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
          getBuildSystem(ti).getDelegate().commandFoundDiscoveredDependency(command, unescapedWord,
                                                                            DiscoveredDependencyKind::Input);
        }
      }